

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

void __thiscall
OpenMesh::PolyConnectivity::split(PolyConnectivity *this,FaceHandle fh,VertexHandle vh)

{
  pointer *ppFVar1;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  HalfedgeHandle _nheh;
  int iVar4;
  FaceHandle _fh;
  HalfedgeHandle HVar5;
  Face *pFVar6;
  Halfedge *pHVar7;
  undefined4 extraout_var;
  Vertex *pVVar8;
  BaseHandle BVar9;
  pointer ppBVar10;
  BaseHandle _nheh_00;
  Face local_48;
  BaseHandle local_44;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,fh);
  HVar5.super_BaseHandle.idx_ = (BaseHandle)(pFVar6->halfedge_handle_).super_BaseHandle.idx_;
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar5);
  BVar9.idx_ = (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar5);
  local_38 = vh.super_BaseHandle.idx_;
  _nheh = ArrayKernel::new_edge
                    (&this->super_ArrayKernel,
                     (VertexHandle)
                     (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_,vh);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,HVar5,_nheh);
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh);
  (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)fh.super_BaseHandle.idx_;
  _nheh_00 = (-((uint)_nheh.super_BaseHandle.idx_ & 1) | 1) + _nheh.super_BaseHandle.idx_;
  local_3c = fh.super_BaseHandle.idx_;
  local_34.idx_ = (int)HVar5.super_BaseHandle.idx_;
  if ((BaseHandle)BVar9.idx_ != HVar5.super_BaseHandle.idx_) {
    do {
      local_44.idx_ = BVar9.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_);
      local_40.idx_ =
           (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
      local_48.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
      __position._M_current =
           (this->super_ArrayKernel).faces_.
           super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ArrayKernel).faces_.
          super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
        _M_realloc_insert<OpenMesh::ArrayItems::Face>
                  (&(this->super_ArrayKernel).faces_,__position,&local_48);
      }
      else {
        ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
        ppFVar1 = &(this->super_ArrayKernel).faces_.
                   super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppFVar1 = *ppFVar1 + 1;
      }
      iVar4 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
      ppBVar2 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar10 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar10 != ppBVar2;
          ppBVar10 = ppBVar10 + 1) {
        pBVar3 = *ppBVar10;
        if (pBVar3 != (BaseProperty *)0x0) {
          (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar4));
        }
      }
      _fh = ArrayKernel::handle(&this->super_ArrayKernel,
                                (this->super_ArrayKernel).faces_.
                                super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
      pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.super_BaseHandle.idx_);
      BVar9.idx_ = local_44.idx_;
      (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = local_44.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_44.idx_);
      HVar5 = ArrayKernel::new_edge
                        (&this->super_ArrayKernel,
                         (VertexHandle)
                         (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_,
                         (VertexHandle)local_38.idx_);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,HVar5,(HalfedgeHandle)_nheh_00.idx_);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)_nheh_00.idx_,(HalfedgeHandle)BVar9.idx_);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_,HVar5);
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,HVar5);
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh.super_BaseHandle.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_nheh_00.idx_);
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh.super_BaseHandle.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_);
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh.super_BaseHandle.idx_;
      _nheh_00 = (-((uint)HVar5.super_BaseHandle.idx_ & 1) | 1) + HVar5.super_BaseHandle.idx_;
      BVar9.idx_ = local_40.idx_;
    } while (local_40.idx_ != local_34.idx_);
  }
  BVar9.idx_ = local_34.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)_nheh_00.idx_,(HalfedgeHandle)local_34.idx_);
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar9.idx_);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,
             (HalfedgeHandle)
             (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_,
             (HalfedgeHandle)_nheh_00.idx_);
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_nheh_00.idx_);
  (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = local_3c.idx_;
  pVVar8 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_38.idx_);
  (pVVar8->halfedge_handle_).super_BaseHandle.idx_ = _nheh_00.idx_;
  return;
}

Assistant:

void PolyConnectivity::split(FaceHandle fh, VertexHandle vh)
{
  HalfedgeHandle hend = halfedge_handle(fh);
  HalfedgeHandle hh   = next_halfedge_handle(hend);

  HalfedgeHandle hold = new_edge(to_vertex_handle(hend), vh);

  set_next_halfedge_handle(hend, hold);
  set_face_handle(hold, fh);

  hold = opposite_halfedge_handle(hold);

  while (hh != hend) {

    HalfedgeHandle hnext = next_halfedge_handle(hh);

    FaceHandle fnew = new_face();
    set_halfedge_handle(fnew, hh);

    HalfedgeHandle hnew = new_edge(to_vertex_handle(hh), vh);

    set_next_halfedge_handle(hnew, hold);
    set_next_halfedge_handle(hold, hh);
    set_next_halfedge_handle(hh, hnew);

    set_face_handle(hnew, fnew);
    set_face_handle(hold, fnew);
    set_face_handle(hh,   fnew);

    hold = opposite_halfedge_handle(hnew);

    hh = hnext;
  }

  set_next_halfedge_handle(hold, hend);
  set_next_halfedge_handle(next_halfedge_handle(hend), hold);

  set_face_handle(hold, fh);

  set_halfedge_handle(vh, hold);
}